

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_rpm.c
# Opt level: O0

ssize_t rpm_filter_read(archive_read_filter *self,void **buff)

{
  long *plVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  size_t __n;
  ulong uVar4;
  undefined8 *in_RSI;
  long in_RDI;
  uint32_t bytes;
  uint32_t section;
  size_t n;
  size_t used;
  ssize_t total;
  ssize_t avail_in;
  uchar *b;
  rpm *rpm;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  archive_read_filter *in_stack_ffffffffffffffa8;
  ssize_t *in_stack_ffffffffffffffb8;
  long lVar5;
  long local_30;
  void *local_28;
  long local_8;
  
  plVar1 = *(long **)(in_RDI + 0x50);
  *in_RSI = 0;
  local_30 = 0;
  local_8 = 0;
  lVar5 = 0;
  local_28 = __archive_read_filter_ahead((archive_read_filter *)0x0,0,in_stack_ffffffffffffffb8);
  if (local_28 != (void *)0x0) {
    in_stack_ffffffffffffffa8 = (archive_read_filter *)(ulong)*(uint *)(plVar1 + 5);
    switch(in_stack_ffffffffffffffa8) {
    case (archive_read_filter *)0x0:
      if (0x5f < *plVar1) {
        lVar5 = (0x60 - *plVar1) + lVar5;
        local_28 = (void *)((0x60 - *plVar1) + (long)local_28);
        *(undefined4 *)(plVar1 + 5) = 1;
        plVar1[1] = 0;
        plVar1[2] = 0;
        *(undefined4 *)((long)plVar1 + 0x2c) = 1;
      }
      break;
    case (archive_read_filter *)0x1:
      __n = 0x10 - plVar1[1];
      if ((ulong)-lVar5 < __n) {
        __n = -lVar5;
      }
      memcpy((void *)((long)plVar1 + plVar1[1] + 0x18),local_28,__n);
      local_28 = (void *)(__n + (long)local_28);
      lVar5 = __n + lVar5;
      plVar1[1] = __n + plVar1[1];
      if (plVar1[1] == 0x10) {
        if (((((char)plVar1[3] == -0x72) && (*(char *)((long)plVar1 + 0x19) == -0x53)) &&
            (*(char *)((long)plVar1 + 0x1a) == -0x18)) && (*(char *)((long)plVar1 + 0x1b) == '\x01')
           ) {
          uVar2 = archive_be32dec(plVar1 + 4);
          uVar3 = archive_be32dec((void *)((long)plVar1 + 0x24));
          plVar1[2] = (ulong)(uVar2 * 0x10 + 0x10 + uVar3);
          *(undefined4 *)(plVar1 + 5) = 2;
          *(undefined4 *)((long)plVar1 + 0x2c) = 0;
        }
        else {
          if (*(int *)((long)plVar1 + 0x2c) != 0) {
            archive_set_error(*(archive **)(in_RDI + 0x18),0x54,"Unrecoginized rpm header");
            return -0x1e;
          }
          *(undefined4 *)(plVar1 + 5) = 4;
          *in_RSI = plVar1 + 3;
          local_8 = plVar1[1];
        }
      }
      break;
    case (archive_read_filter *)0x2:
      uVar4 = plVar1[2] - plVar1[1];
      if ((ulong)-lVar5 < uVar4) {
        uVar4 = -lVar5;
      }
      local_28 = (void *)(uVar4 + (long)local_28);
      lVar5 = uVar4 + lVar5;
      plVar1[1] = uVar4 + plVar1[1];
      if (plVar1[1] == plVar1[2]) {
        *(undefined4 *)(plVar1 + 5) = 3;
      }
      break;
    case (archive_read_filter *)0x3:
      break;
    case (archive_read_filter *)0x4:
      *in_RSI = local_28;
      lVar5 = local_30;
      local_8 = local_30;
    }
    if (lVar5 == 0) {
      *plVar1 = *plVar1;
      __archive_read_filter_consume
                (in_stack_ffffffffffffffa8,
                 CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
      local_28 = (void *)0x0;
      lVar5 = 0;
    }
    in_stack_ffffffffffffffa7 = 0;
  }
  if ((lVar5 != 0) && (local_28 != (void *)0x0)) {
    *plVar1 = lVar5 + *plVar1;
    __archive_read_filter_consume
              (in_stack_ffffffffffffffa8,
               CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
  }
  return local_8;
}

Assistant:

static ssize_t
rpm_filter_read(struct archive_read_filter *self, const void **buff)
{
	struct rpm *rpm;
	const unsigned char *b;
	ssize_t avail_in, total;
	size_t used, n;
	uint32_t section;
	uint32_t bytes;

	rpm = (struct rpm *)self->data;
	*buff = NULL;
	total = avail_in = 0;
	b = NULL;
	used = 0;
	do {
		if (b == NULL) {
			b = __archive_read_filter_ahead(self->upstream, 1,
			    &avail_in);
			if (b == NULL) {
				if (avail_in < 0)
					return (ARCHIVE_FATAL);
				else
					break;
			}
		}

		switch (rpm->state) {
		case ST_LEAD:
			if (rpm->total_in + avail_in < RPM_LEAD_SIZE)
				used += avail_in;
			else {
				n = (size_t)(RPM_LEAD_SIZE - rpm->total_in);
				used += n;
				b += n;
				rpm->state = ST_HEADER;
				rpm->hpos = 0;
				rpm->hlen = 0;
				rpm->first_header = 1;
			}
			break;
		case ST_HEADER:
			n = 16 - rpm->hpos;
			if (n > avail_in - used)
				n = avail_in - used;
			memcpy(rpm->header+rpm->hpos, b, n);
			b += n;
			used += n;
			rpm->hpos += n;

			if (rpm->hpos == 16) {
				if (rpm->header[0] != 0x8e ||
				    rpm->header[1] != 0xad ||
				    rpm->header[2] != 0xe8 ||
				    rpm->header[3] != 0x01) {
					if (rpm->first_header) {
						archive_set_error(
						    &self->archive->archive,
						    ARCHIVE_ERRNO_FILE_FORMAT,
						    "Unrecoginized rpm header");
						return (ARCHIVE_FATAL);
					}
					rpm->state = ST_ARCHIVE;
					*buff = rpm->header;
					total = rpm->hpos;
					break;
				}
				/* Calculate 'Header' length. */
				section = archive_be32dec(rpm->header+8);
				bytes = archive_be32dec(rpm->header+12);
				rpm->hlen = 16 + section * 16 + bytes;
				rpm->state = ST_HEADER_DATA;
				rpm->first_header = 0;
			}
			break;
		case ST_HEADER_DATA:
			n = rpm->hlen - rpm->hpos;
			if (n > avail_in - used)
				n = avail_in - used;
			b += n;
			used += n;
			rpm->hpos += n;
			if (rpm->hpos == rpm->hlen)
				rpm->state = ST_PADDING;
			break;
		case ST_PADDING:
			while (used < (size_t)avail_in) {
				if (*b != 0) {
					/* Read next header. */
					rpm->state = ST_HEADER;
					rpm->hpos = 0;
					rpm->hlen = 0;
					break;
				}
				b++;
				used++;
			}
			break;
		case ST_ARCHIVE:
			*buff = b;
			total = avail_in;
			used = avail_in;
			break;
		}
		if (used == (size_t)avail_in) {
			rpm->total_in += used;
			__archive_read_filter_consume(self->upstream, used);
			b = NULL;
			used = 0;
		}
	} while (total == 0 && avail_in > 0);

	if (used > 0 && b != NULL) {
		rpm->total_in += used;
		__archive_read_filter_consume(self->upstream, used);
	}
	return (total);
}